

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::TestChaCha20
          (CryptoTest *this,string *hex_message,string *hexkey,Nonce96 nonce,uint32_t seek,
          string *hexout)

{
  FastRandomContext *this_00;
  long lVar1;
  pointer pbVar2;
  int iVar3;
  size_t i;
  long lVar4;
  pointer pbVar5;
  uint uVar6;
  int j;
  pointer pbVar7;
  undefined4 in_register_0000008c;
  iterator pvVar8;
  string *psVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  string_view hex_str;
  string_view hex_str_00;
  Span<const_std::byte> key_00;
  Nonce96 nonce_00;
  Span<const_std::byte> input;
  Span<std::byte> out;
  const_string file;
  Span<const_unsigned_char> s;
  Nonce96 nonce_01;
  Span<std::byte> out_00;
  const_string file_00;
  Span<const_unsigned_char> s_00;
  Nonce96 nonce_02;
  Span<const_std::byte> input_00;
  Span<std::byte> out_01;
  const_string file_01;
  Span<const_unsigned_char> s_01;
  Span<std::byte> output;
  Span<std::byte> output_00;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined **local_178;
  undefined1 local_170;
  undefined1 *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  vector<std::byte,_std::allocator<std::byte>_> outres;
  vector<std::byte,_std::allocator<std::byte>_> m;
  vector<std::byte,_std::allocator<std::byte>_> key;
  vector<std::byte,_std::allocator<std::byte>_> only_keystream;
  string local_d0;
  ChaCha20 rng;
  
  pvVar8 = (iterator)CONCAT44(in_register_0000008c,seek);
  pbVar7 = (pointer)nonce.second;
  uVar6 = nonce.first;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  output.m_size = pbVar7;
  ParseHex<std::byte>(&key,hex_str);
  if ((long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("key.size() == 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                  ,0x8d,
                  "void crypto_tests::CryptoTest::TestChaCha20(const std::string &, const std::string &, ChaCha20::Nonce96, uint32_t, const std::string &)"
                 );
  }
  hex_str_00._M_str = (hex_message->_M_dataplus)._M_p;
  hex_str_00._M_len = hex_message->_M_string_length;
  ParseHex<std::byte>(&m,hex_str_00);
  key_00.m_size =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  key_00.m_data =
       key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  ChaCha20::ChaCha20(&rng,key_00);
  nonce_00._4_4_ = 0;
  nonce_00.first = uVar6;
  nonce_00.second = (unsigned_long)pbVar7;
  ChaCha20::Seek(&rng,nonce_00,seek);
  outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<std::byte,_std::allocator<std::byte>_>::resize(&outres,hexout->_M_string_length >> 1);
  if (hex_message->_M_string_length == 0) {
    out.m_size = (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
    out.m_data = outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
    ChaCha20::Keystream(&rng,out);
  }
  else {
    input.m_size = (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_start;
    if (input.m_size * 2 != hexout->_M_string_length) {
      __assert_fail("hex_message.empty() || m.size() * 2 == hexout.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                    ,0x93,
                    "void crypto_tests::CryptoTest::TestChaCha20(const std::string &, const std::string &, ChaCha20::Nonce96, uint32_t, const std::string &)"
                   );
    }
    output.m_size =
         outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
    input.m_data = m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    output.m_data =
         outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    ChaCha20::Crypt(&rng,input,output);
  }
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar8;
  msg.m_begin = (iterator)output.m_size;
  file.m_end = (iterator)0x9b;
  file.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg);
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_180 = "";
  s.m_size = (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  s.m_data = outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_d0,s);
  output.m_size = (pointer)0x2;
  psVar9 = hexout;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_178,&local_188,0x9b,1,2,hexout,"hexout",&local_d0,"HexStr(outres)");
  std::__cxx11::string::~string((string *)&local_d0);
  if (hex_message->_M_string_length != 0) {
    nonce_01._4_4_ = 0;
    nonce_01.first = uVar6;
    nonce_01.second = (unsigned_long)pbVar7;
    ChaCha20::Seek(&rng,nonce_01,seek);
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&only_keystream,
               (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start,(allocator_type *)&local_178);
    out_00.m_size =
         (long)only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    out_00.m_data =
         only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    ChaCha20::Keystream(&rng,out_00);
    for (lVar4 = 0;
        lVar4 != (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start; lVar4 = lVar4 + 1) {
      outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] =
           only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4] ^
           m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4];
    }
    local_198 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_190 = "";
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)psVar9;
    msg_00.m_begin = (iterator)output.m_size;
    file_00.m_end = (iterator)0xa4;
    file_00.m_begin = (iterator)&local_198;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
               msg_00);
    local_170 = 0;
    local_178 = &PTR__lazy_ostream_01139f30;
    local_168 = boost::unit_test::lazy_ostream::inst;
    local_160 = "";
    local_1b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1b0 = "";
    s_00.m_size = (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start;
    s_00.m_data = outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_d0,s_00);
    output.m_size = (pointer)0x2;
    psVar9 = hexout;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_178,&local_1b8,0xa4,1,2,hexout,"hexout",&local_d0,"HexStr(outres)");
    std::__cxx11::string::~string((string *)&local_d0);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  }
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  for (iVar3 = 0; iVar3 != 10; iVar3 = iVar3 + 1) {
    pbVar5 = (pointer)RandomMixin<FastRandomContext>::randrange<unsigned_long>
                                (&this_00->super_RandomMixin<FastRandomContext>,
                                 (hexout->_M_string_length >> 1) + 1);
    only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = pbVar5;
    only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)RandomMixin<FastRandomContext>::randrange<unsigned_long>
                            (&this_00->super_RandomMixin<FastRandomContext>,
                             ((hexout->_M_string_length >> 1) - (long)pbVar5) + 1);
    only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((hexout->_M_string_length >> 1) -
                  (long)(only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_finish + (long)pbVar5));
    nonce_02._4_4_ = 0;
    nonce_02.first = uVar6;
    nonce_02.second = (unsigned_long)pbVar7;
    ChaCha20::Seek(&rng,nonce_02,seek);
    local_178 = (undefined **)((ulong)local_178 & 0xffffffffffffff00);
    std::vector<std::byte,_std::allocator<std::byte>_>::_M_fill_assign
              (&outres,hexout->_M_string_length >> 1,(value_type *)&local_178);
    pbVar5 = (pointer)0x0;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      pbVar2 = (&only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start)[lVar4];
      if (hex_message->_M_string_length == 0) {
        out_01.m_data =
             outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + (long)pbVar5;
        out_01.m_size = (size_t)pbVar2;
        ChaCha20::Keystream(&rng,out_01);
      }
      else {
        input_00.m_data =
             m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + (long)pbVar5;
        output_00.m_data =
             outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + (long)pbVar5;
        input_00.m_size = (size_t)pbVar2;
        output_00.m_size = (size_t)pbVar2;
        output.m_size = pbVar2;
        ChaCha20::Crypt(&rng,input_00,output_00);
      }
      pbVar5 = pbVar5 + (long)pbVar2;
    }
    local_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = (iterator)psVar9;
    msg_01.m_begin = (iterator)output.m_size;
    file_01.m_end = (iterator)0xb9;
    file_01.m_begin = (iterator)&local_1c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d8,
               msg_01);
    local_170 = 0;
    local_178 = &PTR__lazy_ostream_01139f30;
    local_168 = boost::unit_test::lazy_ostream::inst;
    local_160 = "";
    local_1e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1e0 = "";
    s_01.m_size = (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start;
    s_01.m_data = outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_d0,s_01);
    output.m_size = (pointer)0x2;
    psVar9 = hexout;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_178,&local_1e8,0xb9,1,2,hexout,"hexout",&local_d0,"HexStr(outres)");
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  ChaCha20::~ChaCha20(&rng);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&m.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestChaCha20(const std::string &hex_message, const std::string &hexkey, ChaCha20::Nonce96 nonce, uint32_t seek, const std::string& hexout)
{
    auto key = ParseHex<std::byte>(hexkey);
    assert(key.size() == 32);
    auto m = ParseHex<std::byte>(hex_message);
    ChaCha20 rng{key};
    rng.Seek(nonce, seek);
    std::vector<std::byte> outres;
    outres.resize(hexout.size() / 2);
    assert(hex_message.empty() || m.size() * 2 == hexout.size());

    // perform the ChaCha20 round(s), if message is provided it will output the encrypted ciphertext otherwise the keystream
    if (!hex_message.empty()) {
        rng.Crypt(m, outres);
    } else {
        rng.Keystream(outres);
    }
    BOOST_CHECK_EQUAL(hexout, HexStr(outres));
    if (!hex_message.empty()) {
        // Manually XOR with the keystream and compare the output
        rng.Seek(nonce, seek);
        std::vector<std::byte> only_keystream(outres.size());
        rng.Keystream(only_keystream);
        for (size_t i = 0; i != m.size(); i++) {
            outres[i] = m[i] ^ only_keystream[i];
        }
        BOOST_CHECK_EQUAL(hexout, HexStr(outres));
    }

    // Repeat 10x, but fragmented into 3 chunks, to exercise the ChaCha20 class's caching.
    for (int i = 0; i < 10; ++i) {
        size_t lens[3];
        lens[0] = m_rng.randrange(hexout.size() / 2U + 1U);
        lens[1] = m_rng.randrange(hexout.size() / 2U + 1U - lens[0]);
        lens[2] = hexout.size() / 2U - lens[0] - lens[1];

        rng.Seek(nonce, seek);
        outres.assign(hexout.size() / 2U, {});
        size_t pos = 0;
        for (int j = 0; j < 3; ++j) {
            if (!hex_message.empty()) {
                rng.Crypt(Span{m}.subspan(pos, lens[j]), Span{outres}.subspan(pos, lens[j]));
            } else {
                rng.Keystream(Span{outres}.subspan(pos, lens[j]));
            }
            pos += lens[j];
        }
        BOOST_CHECK_EQUAL(hexout, HexStr(outres));
    }
}